

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_then.cpp
# Opt level: O1

void __thiscall tst_qpromise_then::rejectSync(tst_qpromise_then *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> QVar2;
  _func_int **pp_Var3;
  PromiseResolver<int> PVar4;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar5;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> QVar6;
  _func_int **pp_Var7;
  bool bVar8;
  char cVar9;
  PromiseDataBase<int,_void_(const_int_&)> *this_00;
  PromiseDataBase<void,_void_()> *this_01;
  PromiseDataBase<void,_void_()> *this_02;
  char *pcVar10;
  char *pcVar11;
  QPromiseReject<int> *in_R8;
  QSharedData *pQVar12;
  QByteArrayView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  PromiseResolver<void> resolver_2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_188;
  QPromise<void> local_180;
  qsizetype local_170;
  PromiseResolver<int> resolver;
  _Any_data local_138;
  code *local_128;
  code *pcStack_120;
  QPromise<int> input;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_100;
  _Any_data local_f8;
  code *local_e8;
  QSharedData *local_d8;
  QSharedData *local_d0;
  QString error;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  _Any_data local_88;
  code *local_78;
  _func_int **local_68;
  _func_int **local_60;
  _func_int **local_58;
  _Any_data local_50;
  code *local_40;
  
  local_f8._0_4_ = 0x2a;
  QtPromise::QPromiseBase<int>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:263:24),_0>
            (&input.super_QPromiseBase<int>,(anon_class_8_1_a8c68091_conflict)&local_f8);
  input.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001327f0;
  this_00 = (PromiseDataBase<int,_void_(const_int_&)> *)operator_new(0x68);
  this_00->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_00->super_QSharedData = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  this_00[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QString_&)>_> *)0x0;
  *(undefined8 *)&this_00->m_lock = 0;
  *(undefined8 *)&this_00->m_settled = 0;
  *(undefined8 *)&this_00[1].super_QSharedData = 0;
  this_00->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00132890;
  QReadWriteLock::QReadWriteLock(&this_00->m_lock,0);
  local_d0 = &this_00->super_QSharedData;
  this_00->m_settled = false;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QString_&)>_> *)0x0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  this_00->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseData_00132828;
  this_00[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_00[1].super_QSharedData = 0;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  local_f8._M_unused._M_object = &PTR__QPromiseBase_001327f0;
  local_f8._8_8_ = this_00;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver,(QPromise<int> *)&local_f8);
  local_f8._M_unused._M_object = &PTR__QPromiseBase_001326b8;
  if ((PromiseDataBase<int,_void_(const_int_&)> *)local_f8._8_8_ !=
      (PromiseDataBase<int,_void_(const_int_&)> *)0x0) {
    LOCK();
    pQVar12 = (QSharedData *)(local_f8._8_8_ + 8);
    (pQVar12->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar12->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar12->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<int,_void_(const_int_&)> *)local_f8._8_8_ !=
        (PromiseDataBase<int,_void_(const_int_&)> *)0x0)) {
      (**(code **)(*(long *)local_f8._8_8_ + 8))();
    }
  }
  QVar5.d = input.super_QPromiseBase<int>.m_d.d;
  PVar4.m_d.d = resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_138._M_unused._M_object = (void *)resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_68 = (_func_int **)&PTR__QPromiseBase_001326b8;
  local_88._M_unused._M_object = (void *)resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_98 = (code *)0x0;
  pcStack_90 = (code *)0x0;
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_a8._M_unused._M_object = operator_new(0x18);
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
  local_a8._M_unused._0_8_)->d = (Data *)PVar4.m_d.d;
  if (PVar4.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + 1;
    UNLOCK();
  }
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
  ((long)local_a8._M_unused._0_8_ + 8))->d = (Data *)PVar4.m_d.d;
  if (PVar4.m_d.d == (Data *)0x0) {
    pcStack_90 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                 ::_M_invoke;
    local_98 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + 1;
    UNLOCK();
    pcStack_90 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                 ::_M_invoke;
    local_98 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_manager;
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar4.m_d.d == 0) {
      operator_delete((void *)PVar4.m_d.d,0x10);
    }
  }
  if (PVar4.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar4.m_d.d == 0) {
      operator_delete((void *)PVar4.m_d.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&(QVar5.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_int_&)> *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  QVar5.d = input.super_QPromiseBase<int>.m_d.d;
  QtPromisePrivate::PromiseCatcher<int,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50,
             (PromiseCatcher<int,decltype(nullptr),void> *)0x0,&local_138,
             (QPromiseResolve<int> *)&local_88,in_R8);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&(QVar5.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if ((Data *)local_88._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_88._M_unused._0_8_ = *local_88._M_unused._M_object + -1;
    UNLOCK();
    if ((*local_88._M_unused._M_object == 0) && ((Data *)local_88._M_unused._0_8_ != (Data *)0x0)) {
      operator_delete(local_88._M_unused._M_object,0x10);
    }
  }
  if ((Data *)local_138._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_138._M_unused._0_8_ = *local_138._M_unused._M_object + -1;
    UNLOCK();
    if ((*local_138._M_unused._M_object == 0) && ((Data *)local_138._M_unused._0_8_ != (Data *)0x0))
    {
      operator_delete(local_138._M_unused._M_object,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  bVar8 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(input.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar8) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&(input.super_QPromiseBase<int>.m_d.d)->
                super_PromiseDataBase<int,_void_(const_int_&)>);
  }
  error.d.d = (Data *)0x0;
  error.d.ptr = (char16_t *)0x0;
  error.d.size = 0;
  this_01 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  this_01->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_01->super_QSharedData = 0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QString_&)>_> *)0x0;
  *(undefined8 *)&this_01->m_lock = 0;
  *(undefined8 *)&this_01->m_settled = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00132798;
  QReadWriteLock::QReadWriteLock(&this_01->m_lock,0);
  this_01->m_settled = false;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QString_&)>_> *)0x0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00132720;
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  local_d8 = &this_01->super_QSharedData;
  local_58 = (_func_int **)&PTR__QPromiseBase_001326e8;
  local_f8._M_unused._M_object = &PTR__QPromiseBase_001326e8;
  local_f8._8_8_ = this_01;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver
            ((PromiseResolver<void> *)&resolver,(QPromise<void> *)&local_f8);
  local_f8._M_unused._M_object = &PTR__QPromiseBase_00132658;
  if ((PromiseDataBase<void,_void_()> *)local_f8._8_8_ != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar12 = (QSharedData *)(local_f8._8_8_ + 8);
    (pQVar12->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar12->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar12->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<void,_void_()> *)local_f8._8_8_ != (PromiseDataBase<void,_void_()> *)0x0))
    {
      (**(code **)(*(long *)local_f8._8_8_ + 8))();
    }
  }
  PVar4.m_d.d = resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_60 = (_func_int **)&PTR__PromiseDataBase_00132720;
  local_180.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  resolver_2.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_128 = (code *)0x0;
  pcStack_120 = (code *)0x0;
  local_138._M_unused._M_object = (void *)0x0;
  local_138._8_8_ = 0;
  local_138._M_unused._M_object = operator_new(0x18);
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
  local_138._M_unused._0_8_)->d = (Data *)PVar4.m_d.d;
  if (PVar4.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + 1;
    UNLOCK();
  }
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
  ((long)local_138._M_unused._0_8_ + 8))->d = (Data *)PVar4.m_d.d;
  if (PVar4.m_d.d == (Data *)0x0) {
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
    ((long)local_138._M_unused._0_8_ + 0x10))->d = (Data *)&error;
    pcStack_120 = std::
                  _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                  ::_M_invoke;
    local_128 = std::
                _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                ::_M_manager;
  }
  else {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + 1;
    UNLOCK();
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
    ((long)local_138._M_unused._0_8_ + 0x10))->d = (Data *)&error;
    pcStack_120 = std::
                  _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                  ::_M_invoke;
    local_128 = std::
                _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                ::_M_manager;
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar4.m_d.d == 0) {
      operator_delete((void *)PVar4.m_d.d,0x10);
    }
  }
  if (PVar4.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar4.m_d.d == 0) {
      operator_delete((void *)PVar4.m_d.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (this_00,(function<void_(const_int_&)> *)&local_138);
  if (local_128 != (code *)0x0) {
    (*local_128)(&local_138,&local_138,__destroy_functor);
  }
  QtPromisePrivate::PromiseCatcher<int,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_88,
             (PromiseCatcher<int,decltype(nullptr),void> *)0x0,&local_180,
             (QPromiseResolve<void> *)&resolver_2,(QPromiseReject<void> *)in_R8);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (this_00,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_88);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver_2.m_d.d == 0) && (resolver_2.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver_2.m_d.d,0x10);
    }
  }
  if ((Data *)local_180.super_QPromiseBase<void>._vptr_QPromiseBase != (Data *)0x0) {
    LOCK();
    (((QSharedData *)local_180.super_QPromiseBase<void>._vptr_QPromiseBase)->ref).
    super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i
         = (((QSharedData *)local_180.super_QPromiseBase<void>._vptr_QPromiseBase)->ref).
           super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((((QSharedData *)local_180.super_QPromiseBase<void>._vptr_QPromiseBase)->ref).
         super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
         _M_i == 0) &&
       ((Data *)local_180.super_QPromiseBase<void>._vptr_QPromiseBase != (Data *)0x0)) {
      operator_delete(local_180.super_QPromiseBase<void>._vptr_QPromiseBase,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  bVar8 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending(this_00);
  if (!bVar8) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch(this_00);
  }
  this_02 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  this_02->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_02->super_QSharedData = 0;
  (this_02->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_02->m_catchers).d.size = 0;
  (this_02->m_handlers).d.size = 0;
  (this_02->m_catchers).d.d = (Data *)0x0;
  (this_02->m_handlers).d.d = (Data *)0x0;
  (this_02->m_handlers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QString_&)>_> *)0x0;
  *(undefined8 *)&this_02->m_lock = 0;
  *(undefined8 *)&this_02->m_settled = 0;
  (this_02->m_error).m_data._M_exception_object = (void *)0x0;
  this_02->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00132798;
  QReadWriteLock::QReadWriteLock(&this_02->m_lock,0);
  this_02->m_settled = false;
  (this_02->m_handlers).d.d = (Data *)0x0;
  (this_02->m_handlers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QString_&)>_> *)0x0;
  (this_02->m_handlers).d.size = 0;
  (this_02->m_catchers).d.d = (Data *)0x0;
  (this_02->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_02->m_catchers).d.size = 0;
  (this_02->m_error).m_data._M_exception_object = (void *)0x0;
  this_02->_vptr_PromiseDataBase = local_60;
  LOCK();
  (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar12 = &this_02->super_QSharedData;
  LOCK();
  (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_180.super_QPromiseBase<void>._vptr_QPromiseBase = local_58;
  local_180.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)this_02;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_2,&local_180);
  local_180.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00132658;
  if (&(local_180.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> !=
      (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar1 = &((local_180.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (&(local_180.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> !=
        (PromiseDataBase<void,_void_()> *)0x0)) {
      (*((local_180.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
  }
  local_188 = resolver_2.m_d.d;
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
  }
  local_100 = resolver_2.m_d.d;
  QtPromisePrivate::PromiseHandler<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            ((function<void_()> *)&local_f8,(PromiseHandler<void,decltype(nullptr),void> *)0x0,
             &local_188,(QPromiseResolve<void> *)&local_100,(QPromiseReject<void> *)in_R8);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            (this_01,(function<void_()> *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,__destroy_functor);
  }
  QVar6.d = local_100.d;
  QVar2.d = local_188.d;
  if (local_188.d != (Data *)0x0) {
    LOCK();
    ((local_188.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_188.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_100.d != (Data *)0x0) {
    LOCK();
    ((local_100.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_100.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       operator_new(0x18);
  *(Data **)resolver.m_d.d = QVar2.d;
  if (QVar2.d != (Data *)0x0) {
    LOCK();
    ((QVar2.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar2.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  ((Data *)resolver.m_d.d)->promise = (QPromise<int> *)QVar6.d;
  if (QVar6.d == (Data *)0x0) {
    *(QString **)((long)resolver.m_d.d + 0x10) = &error;
  }
  else {
    LOCK();
    ((QVar6.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar6.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    *(QString **)((long)resolver.m_d.d + 0x10) = &error;
    LOCK();
    ((QVar6.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar6.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar6.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar6.d,0x10);
    }
  }
  if (QVar2.d != (Data *)0x0) {
    LOCK();
    ((QVar2.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar2.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar2.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar2.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            (this_01,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver);
  std::
  _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
  ::_M_manager((_Any_data *)&resolver,(_Any_data *)&resolver,__destroy_functor);
  if (local_100.d != (Data *)0x0) {
    LOCK();
    ((local_100.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_100.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if (((__int_type)
         ((local_100.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) &&
       (local_100.d != (Data *)0x0)) {
      operator_delete(local_100.d,0x10);
    }
  }
  if (local_188.d != (Data *)0x0) {
    LOCK();
    ((local_188.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_188.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((local_188.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
       (local_188.d != (Data *)0x0)) {
      operator_delete(local_188.d,0x10);
    }
  }
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver_2.m_d.d == 0) && (resolver_2.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver_2.m_d.d,0x10);
    }
  }
  bVar8 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_01);
  if (!bVar8) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch(this_01);
  }
  bVar8 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_02);
  while (bVar8 != false) {
    QCoreApplication::processEvents();
    QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
    bVar8 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_02);
  }
  LOCK();
  (pQVar12->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar12->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (pQVar12->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar12->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar12->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_02->_vptr_PromiseDataBase[1])(this_02);
  }
  LOCK();
  (pQVar12->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar12->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar12->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_02->_vptr_PromiseDataBase[1])(this_02);
  }
  pp_Var7 = local_68;
  LOCK();
  (local_d8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (local_d8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((local_d8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_01->_vptr_PromiseDataBase[1])(this_01);
  }
  QVar13.m_data = (storage_type *)0x5;
  QVar13.m_size = (qsizetype)&local_180;
  QString::fromUtf8(QVar13);
  pp_Var3 = local_180.super_QPromiseBase<void>._vptr_QPromiseBase;
  QVar14.m_data = error.d.ptr;
  QVar14.m_size = error.d.size;
  QVar15.m_data = (storage_type_conflict *)local_180.super_QPromiseBase<void>.m_d.d;
  QVar15.m_size = local_170;
  cVar9 = QTest::qCompare(QVar14,QVar15,"error","QString{\"foo42\"}",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                          ,0x83);
  if ((QArrayData *)pp_Var3 != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)pp_Var3)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)pp_Var3)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)pp_Var3)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)pp_Var3,2,8);
    }
  }
  QVar5.d = input.super_QPromiseBase<int>.m_d.d;
  if (cVar9 != '\0') {
    bVar8 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      (&(input.super_QPromiseBase<int>.m_d.d)->
                        super_PromiseDataBase<int,_void_(const_int_&)>);
    bVar8 = (bool)(~bVar8 & ((QVar5.d)->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.
                            m_data._M_exception_object == (void *)0x0);
    local_180.super_QPromiseBase<void>._vptr_QPromiseBase =
         (_func_int **)CONCAT71(local_180.super_QPromiseBase<void>._vptr_QPromiseBase._1_7_,bVar8);
    resolver_2.m_d.d._0_1_ = 1;
    pcVar10 = QTest::toString<bool>((bool *)&local_180);
    pcVar11 = QTest::toString<bool>((bool *)&resolver_2);
    cVar9 = QTest::compare_helper
                      (bVar8,"Compared values are not the same",pcVar10,pcVar11,
                       "input.isFulfilled()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                       ,0x84);
    if (cVar9 != '\0') {
      bVar8 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending(this_00);
      bVar8 = (bool)(~bVar8 & (this_00->m_error).m_data._M_exception_object != (void *)0x0);
      local_180.super_QPromiseBase<void>._vptr_QPromiseBase =
           (_func_int **)CONCAT71(local_180.super_QPromiseBase<void>._vptr_QPromiseBase._1_7_,bVar8)
      ;
      resolver_2.m_d.d._0_1_ = 1;
      pcVar10 = QTest::toString<bool>((bool *)&local_180);
      pcVar11 = QTest::toString<bool>((bool *)&resolver_2);
      QTest::compare_helper
                (bVar8,"Compared values are not the same",pcVar10,pcVar11,"output.isRejected()",
                 "true",
                 "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                 ,0x85);
    }
  }
  if (error.d.d != (Data *)0x0) {
    LOCK();
    ((error.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((error.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((error.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(error.d.d)->super_QArrayData,2,8);
    }
  }
  LOCK();
  (local_d0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (local_d0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((local_d0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_00->_vptr_PromiseDataBase[1])(this_00);
  }
  input.super_QPromiseBase<int>._vptr_QPromiseBase = pp_Var7;
  if (input.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar12 = &((input.super_QPromiseBase<int>.m_d.d)->
               super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar12->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar12->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar12->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (input.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((input.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_qpromise_then::rejectSync()
{
    auto input = QtPromise::QPromise<int>::resolve(42);
    auto output = input.then([](int res) {
        throw QString{"foo%1"}.arg(res);
        return 42;
    });

    QString error;
    output
        .then([&](int res) {
            error += "bar" + QString::number(res);
        })
        .fail([&](const QString& err) {
            error += err;
        })
        .wait();

    QCOMPARE(error, QString{"foo42"});
    QCOMPARE(input.isFulfilled(), true);
    QCOMPARE(output.isRejected(), true);
}